

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O1

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  bool bVar1;
  long lVar2;
  Result RVar3;
  void *__s;
  ulong uVar4;
  Enum EVar5;
  ulong uVar6;
  long lVar7;
  value_type *__val;
  OffsetRange OVar8;
  Offset line_offset;
  Offset buffer_file_offset;
  unsigned_long local_60;
  Offset local_58;
  int local_4c;
  size_t local_48;
  OffsetRange *local_40;
  ulong local_38;
  
  uVar6 = (ulong)find_line;
  if (uVar6 < (ulong)((long)(this->line_ranges_).
                            super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->line_ranges_).
                            super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    OVar8 = GetCachedLine(this,find_line);
    *out_range = OVar8;
    return (Result)Ok;
  }
  local_4c = find_line;
  local_40 = out_range;
  __s = operator_new(0x10000);
  memset(__s,0,0x10000);
  if ((this->line_ranges_).
      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->line_ranges_).
      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!line_ranges_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/lexer-source-line-finder.cc"
                  ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
  }
  local_58 = 0;
  uVar4 = (long)(this->line_ranges_).
                super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->line_ranges_).
                super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  bVar1 = uVar6 < uVar4;
  if (uVar4 <= uVar6) {
    if (this->eof_ == false) {
      local_38 = uVar6;
      do {
        RVar3 = LexerSource::Tell((this->source_)._M_t.
                                  super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                  .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl,
                                  &local_58);
        if (RVar3.enum_ == Error) {
          EVar5 = Error;
          goto LAB_0012b1d3;
        }
        local_48 = LexerSource::Fill((this->source_)._M_t.
                                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl
                                     ,__s,0x10000);
        if (local_48 < 0x10000) {
          this->eof_ = true;
        }
        if (0 < (long)local_48) {
          uVar6 = (long)__s + local_48;
          lVar7 = 0;
          do {
            if (*(char *)((long)__s + lVar7) == '\n') {
              local_60 = (local_58 - this->last_cr_) + lVar7;
              std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
              emplace_back<unsigned_long&,unsigned_long&>
                        ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                          *)&this->line_ranges_,&this->next_line_start_,&local_60);
              this->next_line_start_ = local_60 + this->last_cr_ + 1;
            }
            this->last_cr_ = *(char *)((long)__s + lVar7) == '\r';
            lVar2 = lVar7 + 1;
            lVar7 = lVar7 + 1;
          } while ((ulong)((long)__s + lVar2) < uVar6);
        }
        if (this->eof_ != false) {
          local_60 = local_48 + local_58;
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)&this->line_ranges_,&this->next_line_start_,&local_60);
        }
        uVar6 = (long)(this->line_ranges_).
                      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->line_ranges_).
                      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
        bVar1 = local_38 < uVar6;
        if (local_38 < uVar6) goto LAB_0012b1b9;
      } while (this->eof_ == false);
    }
    if (!bVar1) {
      EVar5 = Error;
      if (this->eof_ == false) {
        __assert_fail("eof_",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/lexer-source-line-finder.cc"
                      ,0x78,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)"
                     );
      }
      goto LAB_0012b1d3;
    }
  }
LAB_0012b1b9:
  OVar8 = GetCachedLine(this,local_4c);
  *local_40 = OVar8;
  EVar5 = Ok;
LAB_0012b1d3:
  operator_delete(__s,0x10000);
  return (Result)EVar5;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}